

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O1

string * __thiscall
ser::MetainfoSet::ToString_abi_cxx11_(string *__return_storage_ptr__,MetainfoSet *this)

{
  _Rb_tree_node_base *operand;
  char cVar1;
  pointer pcVar2;
  string *psVar3;
  int iVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ostream *poVar7;
  bool *pbVar8;
  int *piVar9;
  float *pfVar10;
  double *pdVar11;
  _Rb_tree_node_base *p_Var12;
  undefined *puVar13;
  char *pcVar14;
  double dVar15;
  ostringstream ss_1;
  ostringstream ss;
  char *local_368;
  long local_360;
  char local_358 [16];
  string *local_348;
  char *local_340;
  long local_338;
  char local_330 [16];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[ ",2);
  p_Var12 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_348 = __return_storage_ptr__;
  do {
    if ((_Rb_tree_header *)p_Var12 == &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
      psVar3 = local_348;
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      return psVar3;
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=",1);
    puVar13 = &void::typeinfo;
    if (*(long **)(p_Var12 + 2) != (long *)0x0) {
      puVar13 = (undefined *)(**(code **)(**(long **)(p_Var12 + 2) + 0x10))();
    }
    std::__cxx11::ostringstream::ostringstream(local_320);
    operand = p_Var12 + 2;
    pcVar14 = *(char **)(puVar13 + 8);
    if ((pcVar14 == _ofstream) ||
       ((cVar1 = *pcVar14, cVar1 != '*' && (iVar4 = strcmp(pcVar14,_ofstream), iVar4 == 0)))) {
      pbVar8 = boost::any_cast<bool_const&>((any *)operand);
      pcVar14 = "false";
      if ((ulong)*pbVar8 != 0) {
        pcVar14 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,pcVar14,(ulong)*pbVar8 ^ 5);
    }
    else if ((pcVar14 == _put) || ((cVar1 != '*' && (iVar4 = strcmp(pcVar14,_put), iVar4 == 0)))) {
      piVar9 = boost::any_cast<int_const&>((any *)operand);
      std::ostream::operator<<((ostream *)local_320,*piVar9);
    }
    else {
      if ((pcVar14 == _pthread_mutex_init) ||
         ((cVar1 != '*' && (iVar4 = strcmp(pcVar14,_pthread_mutex_init), iVar4 == 0)))) {
        pfVar10 = boost::any_cast<float_const&>((any *)operand);
        dVar15 = (double)*pfVar10;
      }
      else {
        if ((pcVar14 != _typeinfo) &&
           ((cVar1 == '*' || (iVar4 = strcmp(pcVar14,_typeinfo), iVar4 != 0)))) {
          if ((pcVar14 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
             ((cVar1 != '*' &&
              (iVar4 = strcmp(pcVar14,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
              iVar4 == 0)))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\"",1);
            pbVar6 = boost::any_cast<std::__cxx11::string_const&>((any *)operand);
            local_368 = local_358;
            pcVar2 = (pbVar6->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_368,pcVar2,pcVar2 + pbVar6->_M_string_length);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_320,local_368,local_360);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            if (local_368 != local_358) {
              operator_delete(local_368);
            }
          }
          goto LAB_0015eb13;
        }
        pdVar11 = boost::any_cast<double_const&>((any *)operand);
        dVar15 = *pdVar11;
      }
      std::ostream::_M_insert<double>(dVar15);
    }
LAB_0015eb13:
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_340,local_338);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    if (local_340 != local_330) {
      operator_delete(local_340);
    }
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
  } while( true );
}

Assistant:

std::string MetainfoSet::ToString() const
{
    std::ostringstream ss;
    ss << "[ ";

    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        ss << iter->first << "=" << writeAny(iter->second) << " ";
    }

    ss << "]";
    return ss.str();
}